

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

String * doctest::detail::getTlsOssResult(void)

{
  char *in;
  String *in_RDI;
  string local_30 [40];
  
  g_oss_abi_cxx11_();
  std::__cxx11::ostringstream::str();
  in = (char *)std::__cxx11::string::c_str();
  String::String(in_RDI,in);
  std::__cxx11::string::~string(local_30);
  return in_RDI;
}

Assistant:

String getTlsOssResult() {
        //g_oss << std::ends; // needed - as shown here: https://stackoverflow.com/a/624291/3162383
        return g_oss.str().c_str();
    }